

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_hadamard_lp_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  int16_t *coeff_00;
  long lVar6;
  
  uVar5 = 0;
  coeff_00 = coeff;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 4) {
    aom_hadamard_lp_8x8_c
              (src_diff + (ulong)((uint)lVar6 & 8) * src_stride + (ulong)(uVar5 & 8),src_stride,
               coeff_00);
    coeff_00 = coeff_00 + 0x40;
    uVar5 = uVar5 + 8;
  }
  for (lVar6 = 0; (int)lVar6 != 0x40; lVar6 = lVar6 + 1) {
    sVar1 = coeff[lVar6];
    sVar2 = (short)((int)coeff[lVar6 + 0xc0] + (int)coeff[lVar6 + 0x80] >> 1);
    sVar3 = (short)((int)coeff[lVar6 + 0x40] + (int)sVar1 >> 1);
    coeff[lVar6] = sVar2 + sVar3;
    sVar4 = (short)((int)coeff[lVar6 + 0x80] - (int)coeff[lVar6 + 0xc0] >> 1);
    sVar1 = (short)((int)sVar1 - (int)coeff[lVar6 + 0x40] >> 1);
    coeff[lVar6 + 0x40] = sVar4 + sVar1;
    coeff[lVar6 + 0x80] = sVar3 - sVar2;
    coeff[lVar6 + 0xc0] = sVar1 - sVar4;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                             int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_hadamard_lp_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  for (int idx = 0; idx < 64; ++idx) {
    int16_t a0 = coeff[0];
    int16_t a1 = coeff[64];
    int16_t a2 = coeff[128];
    int16_t a3 = coeff[192];

    int16_t b0 = (a0 + a1) >> 1;  // (a0 + a1): 16 bit, [-32640, 32640]
    int16_t b1 = (a0 - a1) >> 1;  // b0-b3: 15 bit, dynamic range
    int16_t b2 = (a2 + a3) >> 1;  // [-16320, 16320]
    int16_t b3 = (a2 - a3) >> 1;

    coeff[0] = b0 + b2;  // 16 bit, [-32640, 32640]
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}